

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

AssertionExpr *
slang::ast::bindAssertionBody
          (Symbol *symbol,SyntaxNode *syntax,ASTContext *context,SourceLocation outputLocalVarArgLoc
          ,AssertionInstanceDetails *instance,SmallVectorBase<const_slang::ast::Symbol_*> *localVars
          )

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  SymbolKind SVar3;
  SyntaxNode *pSVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  SyntaxKind *pSVar12;
  int iVar13;
  Scope *this;
  Symbol *pSVar14;
  undefined4 extraout_var;
  Diagnostic *this_01;
  value_type *pvVar15;
  undefined4 extraout_var_00;
  uint uVar16;
  ulong uVar17;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t extraout_EDX_01;
  socklen_t extraout_EDX_02;
  socklen_t extraout_EDX_03;
  socklen_t extraout_EDX_04;
  socklen_t extraout_EDX_05;
  socklen_t __len;
  AssertionInstanceDetails *pAVar18;
  pointer ppLVar19;
  ulong uVar20;
  long lVar21;
  group_type_pointer pgVar22;
  ulong uVar23;
  uint uVar24;
  value_type *unaff_R12;
  SyntaxNode *pSVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  SourceRange sourceRange;
  try_emplace_args_t local_159;
  LocalAssertionVarSymbol *var;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_150;
  AssertionInstanceDetails *local_148;
  uint64_t local_140;
  basic_string_view<char,_std::char_traits<char>_> *local_138;
  SyntaxNode *local_130;
  ASTContext *local_128;
  SyntaxNode *local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  value_type *elements;
  LocalAssertionVarSymbol *local_f8;
  long local_f0;
  char *local_e8;
  group_type_pointer local_e0;
  value_type *local_d8;
  value_type *local_d0;
  pointer local_c8;
  locator res;
  SmallVector<const_slang::ast::LocalAssertionVarSymbol_*,_5UL> vars;
  AssertionExpr *this_00;
  
  SVar3 = symbol->kind;
  local_148 = instance;
  this = Symbol::scopeOrNull(symbol);
  pSVar25 = syntax[7].parent;
  pSVar4 = syntax[7].previewNode;
  pSVar12 = &pSVar25->kind;
  local_128 = context;
  local_120 = syntax;
  if (SVar3 == Sequence) {
    if (pSVar4 != (SyntaxNode *)0x0) {
      local_150 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                  &local_148->localVars;
      pAVar18 = local_148;
      do {
        vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ =
             (pointer)vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.
                      firstElement;
        vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.len = 0;
        vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.cap = 5;
        LocalAssertionVarSymbol::fromSyntax
                  ((context->scope).ptr,*(LocalVariableDeclarationSyntax **)pSVar25,
                   &vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>);
        if (vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.len != 0) {
          local_c8 = vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ +
                     vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.len;
          ppLVar19 = vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_;
          local_130 = pSVar25;
          do {
            var = *ppLVar19;
            DeclaredType::forceResolveAt
                      (&(var->super_VariableSymbol).super_ValueSymbol.declaredType,context);
            if ((var->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len != 0) {
              local_f8 = var;
              local_138 = &(var->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
              local_140 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                          operator()(local_150,local_138);
              uVar20 = local_140 >>
                       ((byte)(pAVar18->localVars).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                              .arrays.groups_size_index & 0x3f);
              pgVar22 = (pAVar18->localVars).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                        .arrays.groups_;
              lVar21 = (local_140 & 0xff) * 4;
              uVar8 = (&UNK_0051f39c)[lVar21];
              uVar9 = (&UNK_0051f39d)[lVar21];
              uVar10 = (&UNK_0051f39e)[lVar21];
              uVar11 = (&UNK_0051f39f)[lVar21];
              uVar24 = (uint)local_140;
              elements = (pAVar18->localVars).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                         .arrays.elements_;
              uVar17 = (pAVar18->localVars).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                       .arrays.groups_size_mask;
              uVar23 = 0;
              local_108 = uVar20;
              do {
                local_f0 = uVar20 * 0x10;
                pgVar2 = pgVar22 + uVar20;
                auVar27[0] = -(pgVar2->m[0].n == uVar8);
                auVar27[1] = -(pgVar2->m[1].n == uVar9);
                auVar27[2] = -(pgVar2->m[2].n == uVar10);
                auVar27[3] = -(pgVar2->m[3].n == uVar11);
                auVar27[4] = -(pgVar2->m[4].n == uVar8);
                auVar27[5] = -(pgVar2->m[5].n == uVar9);
                auVar27[6] = -(pgVar2->m[6].n == uVar10);
                auVar27[7] = -(pgVar2->m[7].n == uVar11);
                auVar27[8] = -(pgVar2->m[8].n == uVar8);
                auVar27[9] = -(pgVar2->m[9].n == uVar9);
                auVar27[10] = -(pgVar2->m[10].n == uVar10);
                auVar27[0xb] = -(pgVar2->m[0xb].n == uVar11);
                auVar27[0xc] = -(pgVar2->m[0xc].n == uVar8);
                auVar27[0xd] = -(pgVar2->m[0xd].n == uVar9);
                auVar27[0xe] = -(pgVar2->m[0xe].n == uVar10);
                auVar27[0xf] = -(pgVar2->m[0xf].n == uVar11);
                uVar16 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
                local_110 = uVar20;
                if (uVar16 != 0) {
                  pvVar15 = elements + uVar20 * 0xf;
                  sVar5 = (local_f8->super_VariableSymbol).super_ValueSymbol.super_Symbol.name.
                          _M_len;
                  local_e8 = (local_f8->super_VariableSymbol).super_ValueSymbol.super_Symbol.name.
                             _M_str;
                  local_d0 = unaff_R12;
                  local_118 = uVar17;
                  local_e0 = pgVar22;
                  local_d8 = pvVar15;
                  do {
                    uVar7 = 0;
                    if (uVar16 != 0) {
                      for (; (uVar16 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                      }
                    }
                    unaff_R12 = pvVar15 + uVar7;
                    sVar6 = (unaff_R12->first)._M_len;
                    bVar26 = sVar5 == sVar6;
                    if ((sVar5 != 0) && (sVar5 == sVar6)) {
                      iVar13 = bcmp(local_e8,(unaff_R12->first)._M_str,sVar5);
                      bVar26 = iVar13 == 0;
                      pvVar15 = local_d8;
                      pgVar22 = local_e0;
                    }
                    pAVar18 = local_148;
                    context = local_128;
                    pSVar25 = local_130;
                    if (bVar26) goto LAB_004d5e5b;
                    uVar16 = uVar16 - 1 & uVar16;
                    uVar17 = local_118;
                    unaff_R12 = local_d0;
                  } while (uVar16 != 0);
                }
                if ((pgVar22->m[local_f0 + 0xf].n &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[uVar24 & 7]) == 0) break;
                lVar21 = local_110 + uVar23;
                uVar23 = uVar23 + 1;
                uVar20 = lVar21 + 1U & uVar17;
              } while (uVar23 <= uVar17);
              unaff_R12 = (value_type *)0x0;
LAB_004d5e5b:
              pvVar15 = unaff_R12;
              if (unaff_R12 == (value_type *)0x0) {
                if ((pAVar18->localVars).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                    .size_ctrl.size <
                    (pAVar18->localVars).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                    .size_ctrl.ml) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::LocalAssertionVarSymbol_const*&>
                            (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                                   *)local_150,(arrays_type *)local_150,local_108,local_140,
                             &local_159,local_138,&var);
                  psVar1 = &(pAVar18->localVars).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                            .size_ctrl.size;
                  *psVar1 = *psVar1 + 1;
                  pvVar15 = res.p;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::LocalAssertionVarSymbol_const*&>
                            (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                                   *)local_150,local_140,&local_159,local_138,&var);
                  pvVar15 = res.p;
                }
              }
              if (unaff_R12 == (value_type *)0x0) {
                res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)var;
                SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                          ((SmallVectorBase<slang::ast::Symbol_const*> *)localVars,(Symbol **)&res);
                pSVar14 = Scope::find(this,(var->super_VariableSymbol).super_ValueSymbol.
                                           super_Symbol.name);
                if (pSVar14 != (Symbol *)0x0) {
                  Scope::reportNameConflict((context->scope).ptr,(Symbol *)var,pSVar14);
                }
              }
              else {
                Scope::reportNameConflict((context->scope).ptr,(Symbol *)var,pvVar15->second);
              }
            }
            ppLVar19 = ppLVar19 + 1;
          } while (ppLVar19 != local_c8);
        }
        if (vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ !=
            (pointer)vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.
                     firstElement) {
          operator_delete(vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.
                          data_);
        }
        pSVar25 = (SyntaxNode *)&pSVar25->parent;
      } while (pSVar25 != (SyntaxNode *)(pSVar12 + (long)pSVar4 * 2));
    }
    iVar13 = AssertionExpr::bind((int)*(undefined8 *)(local_120 + 8),(sockaddr *)context,0);
    this_00 = (AssertionExpr *)CONCAT44(extraout_var,iVar13);
    AssertionExpr::requireSequence(this_00,context);
    if ((((ulong)outputLocalVarArgLoc & 0xfffffff) != 0) &&
       (AssertionExpr::checkNondegeneracy((NondegeneracyCheckResult *)&vars,this_00),
       ((ulong)vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ & 1) !=
       0)) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(local_120 + 8));
      this_01 = ASTContext::addDiag(context,(DiagCode)0x6c0007,sourceRange);
      Diagnostic::operator<<(this_01,symbol->name);
      Diagnostic::addNote(this_01,(DiagCode)0x50001,outputLocalVarArgLoc);
    }
  }
  else {
    __len = extraout_EDX;
    if (pSVar4 != (SyntaxNode *)0x0) {
      local_150 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                  &local_148->localVars;
      pAVar18 = local_148;
      do {
        vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ =
             (pointer)vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.
                      firstElement;
        vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.len = 0;
        vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.cap = 5;
        LocalAssertionVarSymbol::fromSyntax
                  ((context->scope).ptr,*(LocalVariableDeclarationSyntax **)pSVar25,
                   &vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>);
        __len = extraout_EDX_00;
        if (vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.len != 0) {
          local_c8 = vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ +
                     vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.len;
          ppLVar19 = vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_;
          local_130 = pSVar25;
          do {
            var = *ppLVar19;
            DeclaredType::forceResolveAt
                      (&(var->super_VariableSymbol).super_ValueSymbol.declaredType,context);
            __len = extraout_EDX_01;
            if ((var->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len != 0) {
              local_f8 = var;
              local_138 = &(var->super_VariableSymbol).super_ValueSymbol.super_Symbol.name;
              local_140 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                          operator()(local_150,local_138);
              uVar20 = local_140 >>
                       ((byte)(pAVar18->localVars).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                              .arrays.groups_size_index & 0x3f);
              pgVar22 = (pAVar18->localVars).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                        .arrays.groups_;
              lVar21 = (local_140 & 0xff) * 4;
              uVar8 = (&UNK_0051f39c)[lVar21];
              uVar9 = (&UNK_0051f39d)[lVar21];
              uVar10 = (&UNK_0051f39e)[lVar21];
              uVar11 = (&UNK_0051f39f)[lVar21];
              uVar24 = (uint)local_140;
              elements = (pAVar18->localVars).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                         .arrays.elements_;
              uVar17 = (pAVar18->localVars).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                       .arrays.groups_size_mask;
              uVar23 = 0;
              local_108 = uVar20;
              do {
                local_f0 = uVar20 * 0x10;
                pgVar2 = pgVar22 + uVar20;
                auVar28[0] = -(pgVar2->m[0].n == uVar8);
                auVar28[1] = -(pgVar2->m[1].n == uVar9);
                auVar28[2] = -(pgVar2->m[2].n == uVar10);
                auVar28[3] = -(pgVar2->m[3].n == uVar11);
                auVar28[4] = -(pgVar2->m[4].n == uVar8);
                auVar28[5] = -(pgVar2->m[5].n == uVar9);
                auVar28[6] = -(pgVar2->m[6].n == uVar10);
                auVar28[7] = -(pgVar2->m[7].n == uVar11);
                auVar28[8] = -(pgVar2->m[8].n == uVar8);
                auVar28[9] = -(pgVar2->m[9].n == uVar9);
                auVar28[10] = -(pgVar2->m[10].n == uVar10);
                auVar28[0xb] = -(pgVar2->m[0xb].n == uVar11);
                auVar28[0xc] = -(pgVar2->m[0xc].n == uVar8);
                auVar28[0xd] = -(pgVar2->m[0xd].n == uVar9);
                auVar28[0xe] = -(pgVar2->m[0xe].n == uVar10);
                auVar28[0xf] = -(pgVar2->m[0xf].n == uVar11);
                uVar16 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
                local_110 = uVar20;
                if (uVar16 != 0) {
                  pvVar15 = elements + uVar20 * 0xf;
                  sVar5 = (local_f8->super_VariableSymbol).super_ValueSymbol.super_Symbol.name.
                          _M_len;
                  local_e8 = (local_f8->super_VariableSymbol).super_ValueSymbol.super_Symbol.name.
                             _M_str;
                  local_d0 = unaff_R12;
                  local_118 = uVar17;
                  local_e0 = pgVar22;
                  local_d8 = pvVar15;
                  do {
                    uVar7 = 0;
                    if (uVar16 != 0) {
                      for (; (uVar16 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                      }
                    }
                    unaff_R12 = pvVar15 + uVar7;
                    sVar6 = (unaff_R12->first)._M_len;
                    bVar26 = sVar5 == sVar6;
                    if ((sVar5 != 0) && (sVar5 == sVar6)) {
                      iVar13 = bcmp(local_e8,(unaff_R12->first)._M_str,sVar5);
                      bVar26 = iVar13 == 0;
                      pvVar15 = local_d8;
                      pgVar22 = local_e0;
                    }
                    pAVar18 = local_148;
                    context = local_128;
                    pSVar25 = local_130;
                    if (bVar26) goto LAB_004d6292;
                    uVar16 = uVar16 - 1 & uVar16;
                    uVar17 = local_118;
                    unaff_R12 = local_d0;
                  } while (uVar16 != 0);
                }
                if ((pgVar22->m[local_f0 + 0xf].n &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[uVar24 & 7]) == 0) break;
                lVar21 = local_110 + uVar23;
                uVar23 = uVar23 + 1;
                uVar20 = lVar21 + 1U & uVar17;
              } while (uVar23 <= uVar17);
              unaff_R12 = (value_type *)0x0;
LAB_004d6292:
              pvVar15 = unaff_R12;
              if (unaff_R12 == (value_type *)0x0) {
                if ((pAVar18->localVars).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                    .size_ctrl.size <
                    (pAVar18->localVars).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                    .size_ctrl.ml) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::LocalAssertionVarSymbol_const*&>
                            (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                                   *)local_150,(arrays_type *)local_150,local_108,local_140,
                             &local_159,local_138,&var);
                  psVar1 = &(pAVar18->localVars).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                            .size_ctrl.size;
                  *psVar1 = *psVar1 + 1;
                  pvVar15 = res.p;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::LocalAssertionVarSymbol_const*&>
                            (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                                   *)local_150,local_140,&local_159,local_138,&var);
                  pvVar15 = res.p;
                }
              }
              if (unaff_R12 == (value_type *)0x0) {
                res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)var;
                SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                          ((SmallVectorBase<slang::ast::Symbol_const*> *)localVars,(Symbol **)&res);
                pSVar14 = Scope::find(this,(var->super_VariableSymbol).super_ValueSymbol.
                                           super_Symbol.name);
                __len = extraout_EDX_03;
                if (pSVar14 != (Symbol *)0x0) {
                  Scope::reportNameConflict((context->scope).ptr,(Symbol *)var,pSVar14);
                  __len = extraout_EDX_04;
                }
              }
              else {
                Scope::reportNameConflict((context->scope).ptr,(Symbol *)var,pvVar15->second);
                __len = extraout_EDX_02;
              }
            }
            ppLVar19 = ppLVar19 + 1;
          } while (ppLVar19 != local_c8);
        }
        if (vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.data_ !=
            (pointer)vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.
                     firstElement) {
          operator_delete(vars.super_SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>.
                          data_);
          __len = extraout_EDX_05;
        }
        pSVar25 = (SyntaxNode *)&pSVar25->parent;
      } while (pSVar25 != (SyntaxNode *)(pSVar12 + (long)pSVar4 * 2));
    }
    iVar13 = AssertionExpr::bind((int)*(undefined8 *)(local_120 + 8),(sockaddr *)context,__len);
    this_00 = (AssertionExpr *)CONCAT44(extraout_var_00,iVar13);
  }
  return this_00;
}

Assistant:

static const AssertionExpr& bindAssertionBody(const Symbol& symbol, const SyntaxNode& syntax,
                                              const ASTContext& context,
                                              SourceLocation outputLocalVarArgLoc,
                                              AssertionInstanceDetails& instance,
                                              SmallVectorBase<const Symbol*>& localVars) {
    auto createLocals = [&](auto& syntaxType) {
        auto& scope = symbol.as<Scope>();
        for (auto varSyntax : syntaxType.variables) {
            SmallVector<const LocalAssertionVarSymbol*> vars;
            LocalAssertionVarSymbol::fromSyntax(*context.scope, *varSyntax, vars);
            for (auto var : vars) {
                var->getDeclaredType()->forceResolveAt(context);
                if (!var->name.empty()) {
                    auto [it, inserted] = instance.localVars.emplace(var->name, var);
                    if (inserted) {
                        localVars.push_back(var);

                        // If value successfully inserted then check LRM 16.10 section restriction:
                        // "It's illegal to declare a local variable if it is a formal argument of
                        // a sequence declaration."
                        if (auto other = scope.find(var->name))
                            context.scope->reportNameConflict(*var, *other);
                    }
                    else {
                        context.scope->reportNameConflict(*var, *it->second);
                    }
                }
            }
        }
    };

    if (symbol.kind == SymbolKind::Sequence) {
        auto& sds = syntax.as<SequenceDeclarationSyntax>();
        createLocals(sds);

        auto& result = AssertionExpr::bind(*sds.seqExpr, context);
        result.requireSequence(context);

        if (outputLocalVarArgLoc &&
            result.checkNondegeneracy().status.has(NondegeneracyStatus::AdmitsEmpty)) {
            auto& diag = context.addDiag(diag::LocalVarOutputEmptyMatch,
                                         sds.seqExpr->sourceRange());
            diag << symbol.name;
            diag.addNote(diag::NoteDeclarationHere, outputLocalVarArgLoc);
        }

        return result;
    }
    else {
        auto& pds = syntax.as<PropertyDeclarationSyntax>();
        createLocals(pds);
        return AssertionExpr::bind(*pds.propertySpec, context);
    }
}